

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O3

bool __thiscall Js::DynamicType::LockTypeOnly(DynamicType *this)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  bool bVar6;
  
  TVar1 = this->isLocked;
  iVar4 = (*((this->typeHandler).ptr)->_vptr_DynamicTypeHandler[4])();
  if (TVar1 == true) {
    bVar6 = true;
    if (iVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x42,"(this->GetTypeHandler()->IsLockable())",
                                  "this->GetTypeHandler()->IsLockable()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  else if (iVar4 == 0) {
    bVar6 = false;
  }
  else {
    this->isLocked = true;
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool DynamicType::LockTypeOnly()
    {
        if (GetIsLocked())
        {
            Assert(this->GetTypeHandler()->IsLockable());
            return true;
        }
        if (this->GetTypeHandler()->IsLockable())
        {
            this->isLocked = true;
            return true;
        }
        return false;
    }